

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

hittable_list * cornell_box_plus(void)

{
  vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_> *this;
  hittable_list *in_RDI;
  shared_ptr<lambertian> white;
  shared_ptr<diffuse_light> light;
  shared_ptr<lambertian> green;
  shared_ptr<lambertian> red;
  undefined1 local_18c [4];
  vec3 local_188;
  vec3 local_168;
  undefined1 local_148 [16];
  __shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2> local_138;
  vec3 local_128;
  shared_ptr<constant_texture> local_110;
  undefined1 local_fc [12];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f0;
  __shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2> local_e8;
  shared_ptr<constant_texture> local_d8;
  shared_ptr<constant_texture> local_c8;
  shared_ptr<constant_texture> local_b8;
  value_type local_a8;
  value_type local_98;
  value_type local_88;
  value_type local_78;
  value_type local_68;
  value_type local_58;
  value_type local_48;
  
  (in_RDI->super_hittable)._vptr_hittable = (_func_int **)&PTR_hit_0012c0f8;
  (in_RDI->objects).
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->objects).
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->objects).
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.e[0] = 0.65;
  local_168.e[1] = 0.05;
  local_168.e[2] = 0.05;
  local_128.e[2] = (double)in_RDI;
  std::make_shared<constant_texture,vec3>(&local_188);
  std::make_shared<lambertian,std::shared_ptr<constant_texture>>(&local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188.e + 1));
  local_168.e[0] = 0.73;
  local_168.e[1] = 0.73;
  local_168.e[2] = 0.73;
  std::make_shared<constant_texture,vec3>(&local_188);
  std::make_shared<lambertian,std::shared_ptr<constant_texture>>(&local_110);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188.e + 1));
  local_168.e[0] = 0.12;
  local_168.e[1] = 0.45;
  local_168.e[2] = 0.15;
  std::make_shared<constant_texture,vec3>(&local_188);
  std::make_shared<lambertian,std::shared_ptr<constant_texture>>(&local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188.e + 1));
  local_168.e[0] = 15.0;
  local_168.e[1] = 15.0;
  local_168.e[2] = 15.0;
  std::make_shared<constant_texture,vec3>(&local_188);
  std::make_shared<diffuse_light,std::shared_ptr<constant_texture>>(&local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188.e + 1));
  local_188.e[0]._0_4_ = 0;
  local_138._M_ptr._0_4_ = 0x22b;
  local_148._0_4_ = 0;
  local_128.e[0]._0_4_ = 0x22b;
  local_18c = (undefined1  [4])0x22b;
  std::make_shared<yz_rect,int,int,int,int,int,std::shared_ptr<lambertian>&>
            ((int *)&local_168,(int *)&local_188,(int *)(local_148 + 0x10),(int *)local_148,
             (int *)&local_128,(shared_ptr<lambertian> *)local_18c);
  this = &in_RDI->objects;
  local_48.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_168.e[0];
  local_48.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.e[1];
  local_168.e[0] = 0.0;
  local_168.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168.e + 1));
  local_188.e[0]._0_4_ = 0;
  local_148._0_4_ = 0;
  local_138._M_ptr._0_4_ = 0x22b;
  local_128.e[0]._0_4_ = 0x22b;
  local_18c = (undefined1  [4])0x0;
  std::make_shared<yz_rect,int,int,int,int,int,std::shared_ptr<lambertian>&>
            ((int *)&local_168,(int *)&local_188,(int *)(local_148 + 0x10),(int *)local_148,
             (int *)&local_128,(shared_ptr<lambertian> *)local_18c);
  local_58.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_168.e[0];
  local_58.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.e[1];
  local_168.e[0] = 0.0;
  local_168.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168.e + 1));
  local_138._M_ptr._0_4_ = 0xd5;
  local_148._0_4_ = 0x157;
  local_128.e[0]._0_4_ = 0xe3;
  local_18c = (undefined1  [4])0x14c;
  local_fc._0_4_ = 0x22a;
  std::make_shared<xz_rect,int,int,int,int,int,std::shared_ptr<diffuse_light>&>
            ((int *)&local_188,(int *)(local_148 + 0x10),(int *)local_148,(int *)&local_128,
             (int *)local_18c,(shared_ptr<diffuse_light> *)local_fc);
  std::make_shared<flip_face,std::shared_ptr<xz_rect>>((shared_ptr<xz_rect> *)&local_168);
  local_68.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_168.e[0];
  local_68.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.e[1];
  local_168.e[0] = 0.0;
  local_168.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168.e + 1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188.e + 1));
  local_188.e[0]._0_4_ = 0xd5;
  local_138._M_ptr._0_4_ = 0x157;
  local_148._0_4_ = 0xe3;
  local_128.e[0]._0_4_ = 0x14c;
  local_18c = (undefined1  [4])0x22a;
  std::make_shared<xz_rect,int,int,int,int,int,std::shared_ptr<diffuse_light>&>
            ((int *)&local_168,(int *)&local_188,(int *)(local_148 + 0x10),(int *)local_148,
             (int *)&local_128,(shared_ptr<diffuse_light> *)local_18c);
  local_78.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_168.e[0];
  local_78.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.e[1];
  local_168.e[0] = 0.0;
  local_168.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168.e + 1));
  local_188.e[0]._0_4_ = 0;
  local_138._M_ptr._0_4_ = 0x22b;
  local_148._0_4_ = 0;
  local_128.e[0]._0_4_ = 0x22b;
  local_18c = (undefined1  [4])0x22b;
  std::make_shared<xz_rect,int,int,int,int,int,std::shared_ptr<lambertian>&>
            ((int *)&local_168,(int *)&local_188,(int *)(local_148 + 0x10),(int *)local_148,
             (int *)&local_128,(shared_ptr<lambertian> *)local_18c);
  local_88.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_168.e[0];
  local_88.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.e[1];
  local_168.e[0] = 0.0;
  local_168.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168.e + 1));
  local_188.e[0]._0_4_ = 0;
  local_148._0_4_ = 0;
  local_138._M_ptr._0_4_ = 0x22b;
  local_128.e[0]._0_4_ = 0x22b;
  local_18c = (undefined1  [4])0x0;
  std::make_shared<xz_rect,int,int,int,int,int,std::shared_ptr<lambertian>&>
            ((int *)&local_168,(int *)&local_188,(int *)(local_148 + 0x10),(int *)local_148,
             (int *)&local_128,(shared_ptr<lambertian> *)local_18c);
  local_98.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_168.e[0];
  local_98.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.e[1];
  local_168.e[0] = 0.0;
  local_168.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168.e + 1));
  local_188.e[0] = (double)((ulong)local_188.e[0]._4_4_ << 0x20);
  local_138._M_ptr = (element_type *)CONCAT44(local_138._M_ptr._4_4_,0x22b);
  local_148._0_8_ = (ulong)(uint)local_148._4_4_ << 0x20;
  local_128.e[0] = (double)CONCAT44(local_128.e[0]._4_4_,0x22b);
  local_18c = (undefined1  [4])0x22b;
  std::make_shared<xy_rect,int,int,int,int,int,std::shared_ptr<lambertian>&>
            ((int *)&local_168,(int *)&local_188,(int *)(local_148 + 0x10),(int *)local_148,
             (int *)&local_128,(shared_ptr<lambertian> *)local_18c);
  local_a8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_168.e[0];
  local_a8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_168.e[1];
  local_168.e[0] = 0.0;
  local_168.e[1] = 0.0;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168.e + 1));
  local_168.e[0] = 0.0;
  local_168.e[1] = 0.0;
  local_168.e[2] = 0.0;
  local_188.e[0] = 165.0;
  local_188.e[1] = 330.0;
  local_188.e[2] = 165.0;
  std::make_shared<box,vec3,vec3,std::shared_ptr<lambertian>&>
            ((vec3 *)local_148,&local_168,(shared_ptr<lambertian> *)&local_188);
  local_138._M_ptr = (element_type *)local_148._0_8_;
  local_138._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_;
  local_148._0_8_ = (element_type *)0x0;
  local_148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
  local_188.e[0] = (double)CONCAT44(local_188.e[0]._4_4_,0xf);
  std::make_shared<rotate_y,std::shared_ptr<hittable>&,int>
            ((shared_ptr<hittable> *)&local_168,(int *)(local_148 + 0x10));
  std::__shared_ptr<hittable,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<hittable,(__gnu_cxx::_Lock_policy)2> *)(local_148 + 0x10),
             (__shared_ptr<rotate_y,_(__gnu_cxx::_Lock_policy)2> *)&local_168);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168.e + 1));
  local_168.e[0] = 265.0;
  local_168.e[1] = 0.0;
  local_168.e[2] = 295.0;
  std::make_shared<translate,std::shared_ptr<hittable>&,vec3>
            ((shared_ptr<hittable> *)&local_188,(vec3 *)(local_148 + 0x10));
  std::__shared_ptr<hittable,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<hittable,(__gnu_cxx::_Lock_policy)2> *)(local_148 + 0x10),
             (__shared_ptr<translate,_(__gnu_cxx::_Lock_policy)2> *)&local_188);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188.e + 1));
  std::__shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_e8,(__shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2> *)(local_148 + 0x10));
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,(value_type *)&local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
  local_168.e[0] = 0.0;
  local_168.e[1] = 0.0;
  local_168.e[2] = 0.0;
  local_188.e[0] = 165.0;
  local_188.e[1] = 165.0;
  local_188.e[2] = 165.0;
  std::make_shared<box,vec3,vec3,std::shared_ptr<lambertian>&>
            (&local_128,&local_168,(shared_ptr<lambertian> *)&local_188);
  local_148._0_8_ = local_128.e[0];
  local_148._8_8_ = local_128.e[1];
  local_128.e[0] = 0.0;
  local_128.e[1] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128.e + 1));
  local_188.e[0] = (double)CONCAT44(local_188.e[0]._4_4_,0xffffffee);
  std::make_shared<rotate_y,std::shared_ptr<hittable>&,int>
            ((shared_ptr<hittable> *)&local_168,(int *)local_148);
  std::__shared_ptr<hittable,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<hittable,(__gnu_cxx::_Lock_policy)2> *)local_148,
             (__shared_ptr<rotate_y,_(__gnu_cxx::_Lock_policy)2> *)&local_168);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_168.e + 1));
  local_168.e[0] = 130.0;
  local_168.e[1] = 0.0;
  local_168.e[2] = 65.0;
  std::make_shared<translate,std::shared_ptr<hittable>&,vec3>
            ((shared_ptr<hittable> *)&local_188,(vec3 *)local_148);
  std::__shared_ptr<hittable,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<hittable,(__gnu_cxx::_Lock_policy)2> *)local_148,
             (__shared_ptr<translate,_(__gnu_cxx::_Lock_policy)2> *)&local_188);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188.e + 1));
  std::__shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2> *)(local_fc + 4),
             (__shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2> *)local_148);
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::push_back
            (this,(value_type *)(local_fc + 4));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_d8.super___shared_ptr<constant_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_c8.super___shared_ptr<constant_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_110.super___shared_ptr<constant_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_b8.super___shared_ptr<constant_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return (hittable_list *)local_128.e[2];
}

Assistant:

hittable_list cornell_box_plus() {
    hittable_list objects;

    auto red = make_shared<lambertian>(make_shared<constant_texture>(vec3(0.65, 0.05, 0.05)));
    auto white = make_shared<lambertian>(make_shared<constant_texture>(vec3(0.73, 0.73, 0.73)));
    auto green = make_shared<lambertian>(make_shared<constant_texture>(vec3(0.12, 0.45, 0.15)));
    auto light = make_shared<diffuse_light>(make_shared<constant_texture>(vec3(15, 15, 15)));

    objects.add(make_shared<yz_rect>(0, 555, 0, 555, 555, green));
    objects.add(make_shared<yz_rect>(0, 555, 0, 555, 0, red));
    objects.add(make_shared<flip_face>(make_shared<xz_rect>(213, 343, 227, 332, 554, light)));
    objects.add(make_shared<xz_rect>(213, 343, 227, 332, 554, light));
    objects.add(make_shared<xz_rect>(0, 555, 0, 555, 555, white));
    objects.add(make_shared<xz_rect>(0, 555, 0, 555, 0, white));
    objects.add(make_shared<xy_rect>(0, 555, 0, 555, 555, white));

    shared_ptr<hittable> box1 = make_shared<box>(vec3(0,0,0), vec3(165,330,165), white);
    box1 = make_shared<rotate_y>(box1, 15);
    box1 = make_shared<translate>(box1, vec3(265,0,295));
    objects.add(box1);

    shared_ptr<hittable> box2 = make_shared<box>(vec3(0,0,0), vec3(165,165,165), white);
    box2 = make_shared<rotate_y>(box2, -18);
    box2 = make_shared<translate>(box2, vec3(130,0,65));
    objects.add(box2);

    return objects;
}